

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O3

void __thiscall QResourcePrivate::ensureInitialized(QResourcePrivate *this)

{
  QString *this_00;
  QStringView *pQVar1;
  qsizetype qVar2;
  bool bVar3;
  short sVar4;
  CutResult CVar5;
  QArrayData *size;
  QArrayData *pQVar6;
  long in_FS_OFFSET;
  QLatin1StringView rhs;
  QStringView lhs;
  QStringBuilder<char16_t,_const_QString_&> local_88;
  QString local_78;
  QString local_58;
  QStringView local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->related).d.size != 0) ||
     ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1)) goto LAB_00250f2f;
  if (((this->fileName).d.size == 1) &&
     (rhs.m_data = ":", rhs.m_size = 1, lhs.m_data = (this->fileName).d.ptr, lhs.m_size = 1,
     bVar3 = QtPrivate::equalStrings(lhs,rhs), bVar3)) {
    QString::append(&this->fileName,(QChar)0x2f);
  }
  this_00 = &this->absoluteFilePath;
  QString::operator=(this_00,&this->fileName);
  bVar3 = QString::startsWith(this_00,(QChar)0x3a,CaseSensitive);
  if (!bVar3) {
    QString::insert(this_00,0,(QChar)0x3a);
  }
  pQVar6 = (QArrayData *)(this->fileName).d.ptr;
  local_38.m_size = (this->fileName).d.size;
  local_38.m_data = (storage_type_conflict *)pQVar6;
  if ((QArrayData *)local_38.m_size == (QArrayData *)0x0) {
LAB_00250e63:
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)CONCAT62(local_78.d.d._2_6_,0x2f);
    local_78.d.ptr = (char16_t *)&local_38;
    QStringBuilder<char16_t,_QStringView_&>::convertTo<QString>
              (&local_58,(QStringBuilder<char16_t,_QStringView_&> *)&local_78);
    bVar3 = load(this,&local_58);
    if (bVar3) {
      local_88.a = L':';
      local_88.b = &local_58;
      QStringBuilder<char16_t,_const_QString_&>::convertTo<QString>(&local_78,&local_88);
      pQVar6 = &((this->absoluteFilePath).d.d)->super_QArrayData;
      pQVar1 = (QStringView *)(this->absoluteFilePath).d.ptr;
      (this->absoluteFilePath).d.d = local_78.d.d;
      (this->absoluteFilePath).d.ptr = local_78.d.ptr;
      qVar2 = (this->absoluteFilePath).d.size;
      (this->absoluteFilePath).d.size = local_78.d.size;
      local_78.d.d = (Data *)pQVar6;
      local_78.d.ptr = (char16_t *)pQVar1;
      local_78.d.size = qVar2;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,2,0x10);
        }
      }
    }
  }
  else {
    sVar4 = (short)(pQVar6->ref_)._q_value.super___atomic_base<int>._M_i;
    size = (QArrayData *)local_38.m_size;
    if (sVar4 == 0x3a) {
      local_58.d.d = (Data *)0x1;
      local_78.d.d = (Data *)0xffffffffffffffff;
      CVar5 = QtPrivate::QContainerImplHelper::mid
                        (local_38.m_size,(qsizetype *)&local_58,(qsizetype *)&local_78);
      local_38.m_data = (storage_type_conflict *)0x0;
      pQVar6 = (QArrayData *)
               ((long)&(pQVar6->ref_)._q_value.super___atomic_base<int>._M_i +
               (long)local_58.d.d * 2);
      local_38.m_size = (qsizetype)local_38.m_data;
      if (CVar5 != Null) {
        local_38.m_data = (storage_type_conflict *)pQVar6;
        local_38.m_size = (qsizetype)local_78.d.d;
      }
      if ((QArrayData *)local_38.m_size == (QArrayData *)0x0) goto LAB_00250e63;
      sVar4 = (short)(((QArrayData *)local_38.m_data)->ref_)._q_value.super___atomic_base<int>._M_i;
      size = &(local_78.d.d)->super_QArrayData;
    }
    if (sVar4 != 0x2f) goto LAB_00250e63;
    QString::QString(&local_58,(QChar *)pQVar6,(qsizetype)size);
    load(this,&local_58);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00250f2f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QResourcePrivate::ensureInitialized() const
{
    if (!related.isEmpty())
        return;
    if (resourceGlobalData.isDestroyed())
        return;
    QResourcePrivate *that = const_cast<QResourcePrivate *>(this);
    if (fileName == ":"_L1)
        that->fileName += u'/';
    that->absoluteFilePath = fileName;
    if (!that->absoluteFilePath.startsWith(u':'))
        that->absoluteFilePath.prepend(u':');

    QStringView path(fileName);
    if (path.startsWith(u':'))
        path = path.mid(1);

    if (path.startsWith(u'/')) {
        that->load(path.toString());
    } else {
        // Should we search QDir::searchPath() before falling back to root ?
        const QString searchPath(u'/' + path);
        if (that->load(searchPath))
            that->absoluteFilePath = u':' + searchPath;
    }
}